

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_icu::num_parse<wchar_t>::num_parse
          (num_parse<wchar_t> *this,cdata *d,size_t refs)

{
  *(uint *)&this->field_0x8 = (uint)(refs != 0);
  *(undefined ***)this = &PTR__num_parse_001db4a8;
  icu_70::Locale::Locale(&this->loc_,&d->locale);
  std::__cxx11::string::string((string *)&this->enc_,(string *)&d->encoding);
  return;
}

Assistant:

num_parse(cdata const &d,size_t refs = 0) : 
        std::num_get<CharType>(refs),
        loc_(d.locale),
        enc_(d.encoding)
    {
    }